

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

char * readstr(FILE *file)

{
  int iVar1;
  char *__ptr;
  ulong uVar2;
  size_t __size;
  
  __size = 0x10;
  uVar2 = 0;
  __ptr = (char *)0x0;
  while( true ) {
    if (__size <= uVar2 || __ptr == (char *)0x0) {
      __size = __size * 2;
      __ptr = (char *)realloc(__ptr,__size);
      if (__ptr == (char *)0x0) {
        return (char *)0x0;
      }
    }
    iVar1 = getc((FILE *)file);
    if (iVar1 == -1) break;
    __ptr[uVar2] = (char)iVar1;
    uVar2 = uVar2 + 1;
    if ((char)iVar1 == '\0') {
      return __ptr;
    }
  }
  free(__ptr);
  return (char *)0x0;
}

Assistant:

static char *readstr(FILE *file)
{
	// Default buffer size, have it close to the average string length
	size_t capacity = 32 / 2;
	size_t index = -1;
	// Force the first iteration to allocate
	char *str = NULL;

	do {
		// Prepare going to next char
		index++;

		// If the buffer isn't suitable to write the next char...
		if (index >= capacity || !str) {
			capacity *= 2;
			str = (char *)realloc(str, capacity);
			// End now in case of error
			if (!str)
				return NULL;
		}

		// Read char
		int byte = getc(file);

		if (byte == EOF) {
			free(str);
			return NULL;
		}
		str[index] = byte;
	} while (str[index]);
	return str;
}